

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkVector.h
# Opt level: O2

void __thiscall
TPZChunkVector<TPZGraphNode,_10>::~TPZChunkVector(TPZChunkVector<TPZGraphNode,_10> *this)

{
  ~TPZChunkVector(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TPZChunkVector<T, EXP>::~TPZChunkVector() {
    int64_t nchunks = fVec.NElements();

    for (int64_t i = 0; i < nchunks; i++) {
        if (fVec[i]) delete[] fVec[i];
    }
}